

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O2

MessageLite * __thiscall
google::protobuf::internal::ExtensionSet::MutableMessage
          (ExtensionSet *this,int number,FieldType type,MessageLite *prototype,
          FieldDescriptor *descriptor)

{
  byte bVar1;
  bool bVar2;
  CppType CVar3;
  int iVar4;
  LogMessage *pLVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  LogFinisher local_69;
  LogMessage local_68;
  Extension *extension;
  MessageLite *pMVar6;
  
  bVar2 = MaybeNewExtension(this,number,descriptor,&extension);
  if (bVar2) {
    extension->type = type;
    CVar3 = anon_unknown_29::cpp_type(type);
    if (CVar3 != CPPTYPE_MESSAGE) {
      LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x23a);
      pLVar5 = LogMessage::operator<<
                         (&local_68,
                          "CHECK failed: (cpp_type(extension->type)) == (WireFormatLite::CPPTYPE_MESSAGE): "
                         );
      LogFinisher::operator=(&local_69,pLVar5);
      LogMessage::~LogMessage(&local_68);
    }
    extension->is_repeated = false;
    extension->field_0xa = extension->field_0xa & 0xf;
    iVar4 = (*prototype->_vptr_MessageLite[4])(prototype,this->arena_);
    pMVar6 = (MessageLite *)CONCAT44(extraout_var,iVar4);
    (extension->field_0).int64_value = (int64)pMVar6;
    extension->field_0xa = extension->field_0xa & 0xf0;
  }
  else {
    if (extension->is_repeated != false) {
      LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x241);
      pLVar5 = LogMessage::operator<<
                         (&local_68,
                          "CHECK failed: ((*extension).is_repeated ? REPEATED : OPTIONAL) == (OPTIONAL): "
                         );
      LogFinisher::operator=(&local_69,pLVar5);
      LogMessage::~LogMessage(&local_68);
    }
    CVar3 = anon_unknown_29::cpp_type(extension->type);
    if (CVar3 != CPPTYPE_MESSAGE) {
      LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x241);
      pLVar5 = LogMessage::operator<<
                         (&local_68,
                          "CHECK failed: (cpp_type((*extension).type)) == (WireFormatLite::CPPTYPE_MESSAGE): "
                         );
      LogFinisher::operator=(&local_69,pLVar5);
      LogMessage::~LogMessage(&local_68);
    }
    bVar1 = extension->field_0xa;
    extension->field_0xa = bVar1 & 0xf0;
    pMVar6 = (extension->field_0).message_value;
    if ((bVar1 & 0x10) != 0) {
      iVar4 = (*pMVar6->_vptr_MessageLite[4])(pMVar6,prototype);
      pMVar6 = (MessageLite *)CONCAT44(extraout_var_00,iVar4);
    }
  }
  return pMVar6;
}

Assistant:

MessageLite* ExtensionSet::MutableMessage(int number, FieldType type,
                                          const MessageLite& prototype,
                                          const FieldDescriptor* descriptor) {
  Extension* extension;
  if (MaybeNewExtension(number, descriptor, &extension)) {
    extension->type = type;
    GOOGLE_DCHECK_EQ(cpp_type(extension->type), WireFormatLite::CPPTYPE_MESSAGE);
    extension->is_repeated = false;
    extension->is_lazy = false;
    extension->message_value = prototype.New(arena_);
    extension->is_cleared = false;
    return extension->message_value;
  } else {
    GOOGLE_DCHECK_TYPE(*extension, OPTIONAL, MESSAGE);
    extension->is_cleared = false;
    if (extension->is_lazy) {
      return extension->lazymessage_value->MutableMessage(prototype);
    } else {
      return extension->message_value;
    }
  }
}